

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

void Aig_ObjComputeCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint uVar6;
  Aig_Cut_t *pCut;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Aig_Cut_t *pCut1;
  Aig_Cut_t *pAVar11;
  Aig_Cut_t *pCut0;
  
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                  ,0x247,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  if (p->pCuts[pObj->Id] != (Aig_Cut_t *)0x0) {
    __assert_fail("Aig_ObjCuts(p, pObj) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                  ,0x248,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  pAVar2 = pObj->pFanin0;
  pAVar3 = pObj->pFanin1;
  Aig_ObjPrepareCuts(p,pObj,fTriv);
  iVar5 = p->nCutsMax;
  if (0 < iVar5) {
    pCut0 = p->pCuts[*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)];
    iVar8 = 0;
    do {
      if (0 < iVar5 && '\0' < pCut0->nFanins) {
        pCut1 = p->pCuts[*(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24)];
        iVar9 = 0;
        do {
          if (('\0' < pCut1->nFanins) &&
             (uVar6 = pCut1->uSign | pCut0->uSign,
             uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555),
             uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333),
             uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707),
             uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f),
             (int)((uVar6 >> 0x10) + (uVar6 & 0xffff)) <= p->nLeafMax)) {
            pCut = p->pCuts[pObj->Id];
            pAVar11 = (Aig_Cut_t *)0x0;
            do {
              if (pCut->nFanins == '\0') goto LAB_0062a2e5;
              if ((pAVar11 == (Aig_Cut_t *)0x0) || (pAVar11->Cost < pCut->Cost)) {
                pAVar11 = pCut;
              }
              pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            pAVar11->nFanins = '\0';
            pCut = pAVar11;
LAB_0062a2e5:
            iVar5 = Aig_CutMerge(p,pCut0,pCut1,pCut);
            if (iVar5 == 0) {
              if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x259,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar5 = Aig_CutFilter(p,pObj,pCut);
              if (iVar5 == 0) {
                if (p->fTruth != 0) {
                  Aig_CutComputeTruth(p,pCut,pCut0,pCut1,*(uint *)&pObj->pFanin0 & 1,
                                      *(uint *)&pObj->pFanin1 & 1);
                }
                uVar7 = (ulong)pCut->nFanins;
                if ((long)uVar7 < 1) {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                                ,0xb5,"int Aig_CutFindCost(Aig_ManCut_t *, Aig_Cut_t *)");
                }
                pVVar4 = p->pAig->vObjs;
                if (pVVar4 == (Vec_Ptr_t *)0x0) {
                  uVar6 = 0;
                }
                else {
                  uVar10 = 0;
                  iVar5 = 0;
                  do {
                    iVar1 = *(int *)((long)&pCut[1].pNext + uVar10 * 4);
                    if (((long)iVar1 < 0) || (pVVar4->nSize <= iVar1)) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    if (pVVar4->pArray[iVar1] == (void *)0x0) break;
                    iVar5 = iVar5 + (*(uint *)((long)pVVar4->pArray[iVar1] + 0x18) >> 6);
                    uVar10 = uVar10 + 1;
                  } while (uVar7 != uVar10);
                  uVar6 = iVar5 * 1000;
                }
                iVar5 = (int)((ulong)uVar6 / (uVar7 & 0xffffffff));
                pCut->Cost = iVar5;
                if (iVar5 < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                                ,0x268,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
                }
              }
              else if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x25f,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
          }
          iVar9 = iVar9 + 1;
          pCut1 = (Aig_Cut_t *)((long)&pCut1->pNext + (long)pCut1->nCutSize);
          iVar5 = p->nCutsMax;
        } while (iVar9 < iVar5);
      }
      iVar8 = iVar8 + 1;
      pCut0 = (Aig_Cut_t *)((long)&pCut0->pNext + (long)pCut0->nCutSize);
    } while (iVar8 < iVar5);
  }
  return;
}

Assistant:

void Aig_ObjComputeCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    int i, k;
    // the node is not processed yet
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjCuts(p, pObj) == NULL );
    // set up the first cut
    pCutSet = Aig_ObjPrepareCuts( p, pObj, fTriv );
    // compute pair-wise cut combinations while checking table
    Aig_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Aig_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Aig_CutFindFree( p, pObj );
        // assemble the new cut
        if ( !Aig_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Aig_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        if ( p->fTruth )
            Aig_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // assign the cost
        pCut->Cost = Aig_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
}